

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_>::Data
          (Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> *this,
          Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> *other)

{
  Entry *pEVar1;
  Span *pSVar2;
  Entry *pEVar3;
  undefined8 uVar4;
  ulong uVar5;
  Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength> *pNVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  long in_FS_OFFSET;
  R RVar10;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar8 = other->numBuckets;
  sVar9 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar9;
  this->spans = (Span *)0x0;
  RVar10 = allocateSpans(sVar8);
  this->spans = (Span *)RVar10.spans;
  lVar7 = 0;
  for (sVar8 = 0; sVar8 != RVar10.nSpans; sVar8 = sVar8 + 1) {
    pSVar2 = other->spans;
    for (sVar9 = 0; sVar9 != 0x80; sVar9 = sVar9 + 1) {
      uVar5 = (ulong)pSVar2->offsets[sVar9 + lVar7];
      if (uVar5 != 0xff) {
        pEVar3 = pSVar2[sVar8].entries;
        local_48.span = this->spans + sVar8;
        local_48.index = sVar9;
        pNVar6 = Bucket::insert(&local_48);
        pEVar1 = pEVar3 + uVar5;
        uVar4 = *(undefined8 *)((pEVar1->storage).data + 8);
        pNVar6->key = *(uchar **)(pEVar1->storage).data;
        *(undefined8 *)&pNVar6->value = uVar4;
        (pNVar6->value).length = *(size_t *)(pEVar3[uVar5].storage.data + 0x10);
      }
    }
    lVar7 = lVar7 + 0x90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }